

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O2

ON_Quaternion *
ON_Quaternion::Rotation(ON_Quaternion *__return_storage_ptr__,double angle,ON_3dVector *axis)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ON_3dVector::Length(axis);
  dVar2 = 0.0;
  if (0.0 < dVar1) {
    dVar2 = sin(angle * 0.5);
    dVar2 = dVar2 / dVar1;
  }
  dVar1 = cos(angle * 0.5);
  ON_Quaternion(__return_storage_ptr__,dVar1,axis->x * dVar2,axis->y * dVar2,dVar2 * axis->z);
  return __return_storage_ptr__;
}

Assistant:

ON_Quaternion ON_Quaternion::Rotation(double angle, const ON_3dVector& axis)
{
  double s = axis.Length();
  s = (s > 0.0) ? sin(0.5*angle)/s : 0.0;
  return ON_Quaternion(cos(0.5*angle),s*axis.x,s*axis.y,s*axis.z);
}